

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void lyxml_unlink_elem(ly_ctx *ctx,lyxml_elem *elem,int copy_ns)

{
  lyxml_elem *plVar1;
  lyxml_elem *plVar2;
  lyxml_elem *plVar3;
  lyxml_elem *plVar4;
  
  if (elem != (lyxml_elem *)0x0) {
    plVar1 = elem->parent;
    if (plVar1 != (lyxml_elem *)0x0) {
      if (plVar1->child == elem) {
        plVar1->child = elem->next;
      }
      elem->parent = (lyxml_elem *)0x0;
    }
    if (copy_ns < 2) {
      lyxml_correct_elem_ns(ctx,elem,copy_ns,1);
    }
    if (elem->prev != elem) {
      plVar2 = elem->next;
      plVar4 = plVar2;
      if (plVar2 == (lyxml_elem *)0x0) {
        plVar3 = elem;
        if (plVar1 == (lyxml_elem *)0x0) {
          do {
            plVar4 = plVar3;
            plVar3 = plVar4->prev;
          } while (plVar4->prev->next != (lyxml_elem *)0x0);
        }
        else {
          plVar4 = plVar1->child;
        }
      }
      plVar4->prev = elem->prev;
      if (elem->prev->next != (lyxml_elem *)0x0) {
        elem->prev->next = plVar2;
      }
      elem->next = (lyxml_elem *)0x0;
      elem->prev = elem;
    }
  }
  return;
}

Assistant:

void
lyxml_unlink_elem(struct ly_ctx *ctx, struct lyxml_elem *elem, int copy_ns)
{
    struct lyxml_elem *parent, *first;

    if (!elem) {
        return;
    }

    /* store pointers to important nodes */
    parent = elem->parent;

    /* unlink from parent */
    if (parent) {
        if (parent->child == elem) {
            /* we unlink the first child */
            /* update the parent's link */
            parent->child = elem->next;
        }
        /* forget about the parent */
        elem->parent = NULL;
    }

    if (copy_ns < 2) {
        lyxml_correct_elem_ns(ctx, elem, copy_ns, 1);
    }

    /* unlink from siblings */
    if (elem->prev == elem) {
        /* there are no more siblings */
        return;
    }
    if (elem->next) {
        elem->next->prev = elem->prev;
    } else {
        /* unlinking the last element */
        if (parent) {
            first = parent->child;
        } else {
            first = elem;
            while (first->prev->next) {
                first = first->prev;
            }
        }
        first->prev = elem->prev;
    }
    if (elem->prev->next) {
        elem->prev->next = elem->next;
    }

    /* clean up the unlinked element */
    elem->next = NULL;
    elem->prev = elem;
}